

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_cp_destroy(opj_cp_v2_t *p_cp)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  OPJ_UINT32 i;
  opj_tcp_v2_t *l_current_tile;
  OPJ_UINT32 l_nb_tiles;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  
  if (in_RDI != 0) {
    if (*(long *)(in_RDI + 0x60) != 0) {
      iVar1 = *(int *)(in_RDI + 0x24);
      iVar2 = *(int *)(in_RDI + 0x20);
      for (uVar3 = 0; uVar3 < (uint)(iVar1 * iVar2); uVar3 = uVar3 + 1) {
        j2k_tcp_destroy((opj_tcp_v2_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
      }
      free(*(void **)(in_RDI + 0x60));
      *(undefined8 *)(in_RDI + 0x60) = 0;
    }
    if (*(long *)(in_RDI + 0x40) != 0) {
      free(*(void **)(in_RDI + 0x40));
      *(undefined8 *)(in_RDI + 0x40) = 0;
    }
    if (*(long *)(in_RDI + 0x18) != 0) {
      free(*(void **)(in_RDI + 0x18));
      *(undefined8 *)(in_RDI + 0x18) = 0;
    }
    if (((*(byte *)(in_RDI + 0x88) >> 1 & 1) == 0) && (*(long *)(in_RDI + 0x78) != 0)) {
      free(*(void **)(in_RDI + 0x78));
      *(undefined8 *)(in_RDI + 0x78) = 0;
    }
  }
  return;
}

Assistant:

void j2k_cp_destroy (opj_cp_v2_t *p_cp)
{
	OPJ_UINT32 l_nb_tiles;
	opj_tcp_v2_t * l_current_tile = 00;
	OPJ_UINT32 i;

	if
		(p_cp == 00)
	{
		return;
	}
	if
		(p_cp->tcps != 00)
	{
		l_current_tile = p_cp->tcps;
		l_nb_tiles = p_cp->th * p_cp->tw;

		for
			(i = 0; i < l_nb_tiles; ++i)
		{
			j2k_tcp_destroy(l_current_tile);
			++l_current_tile;
		}
		opj_free(p_cp->tcps);
		p_cp->tcps = 00;
	}
	if
		(p_cp->ppm_buffer != 00)
	{
		opj_free(p_cp->ppm_buffer);
		p_cp->ppm_buffer = 00;
	}
	if
		(p_cp->comment != 00)
	{
		opj_free(p_cp->comment);
		p_cp->comment = 00;
	}
	if
		(! p_cp->m_is_decoder)
	{
		if
			(p_cp->m_specific_param.m_enc.m_matrice)
		{
			opj_free(p_cp->m_specific_param.m_enc.m_matrice);
			p_cp->m_specific_param.m_enc.m_matrice = 00;
		}
	}
}